

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

int __thiscall CVmObjClass::get_superclass_count(CVmObjClass *this,vm_obj_id_t param_1)

{
  int iVar1;
  vm_meta_entry_t *pvVar2;
  
  pvVar2 = get_meta_entry(this);
  if (pvVar2 != (vm_meta_entry_t *)0x0) {
    iVar1 = (*pvVar2->meta_->_vptr_CVmMetaclass[8])();
    return iVar1;
  }
  return 0;
}

Assistant:

int CVmObjClass::get_superclass_count(VMG_ vm_obj_id_t) const
{
    /* get my metaclass table entry */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);

    /* 
     *   if we have a valid entry, ask the metaclass object to tell us the
     *   superclass count 
     */
    if (entry != 0)
        return entry->meta_->get_supermeta_count(vmg0_);
    else
        return 0;
}